

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnRefNullExpr(BinaryReaderIR *this,Type type)

{
  Type local_30;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  BinaryReaderIR *local_20;
  BinaryReaderIR *this_local;
  Type type_local;
  
  local_20 = this;
  unique0x1000009d = type;
  std::make_unique<wabt::RefTypeExpr<(wabt::ExprType)37>,wabt::Type&>(&local_30);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,
             (unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>_>_>
              *)&local_30);
  type_local.enum_ = (Enum)AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::
  unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>_>_>
  ::~unique_ptr((unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>_>_>
                 *)&local_30);
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderIR::OnRefNullExpr(Type type) {
  return AppendExpr(std::make_unique<RefNullExpr>(type));
}